

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

double units::getNumberBlock(string *ustring,size_t *index)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  double dVar6;
  size_t ival;
  double local_50;
  size_t ind;
  double local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> substr;
  
  if (*(ustring->_M_dataplus)._M_p == '(') {
    ival = 1;
    bVar3 = segmentcheck(ustring,')',&ival);
    if (!bVar3) {
      return NAN;
    }
    if (ival == 2) {
      *index = 2;
      return 1.0;
    }
    bVar3 = false;
    for (uVar4 = 1; uVar4 < ival - 1; uVar4 = uVar4 + 1) {
      bVar1 = (ustring->_M_dataplus)._M_p[uVar4];
      bVar2 = bVar3;
      if (9 < (byte)(bVar1 - 0x30)) {
        uVar5 = bVar1 - 0x28;
        if (0x3d < uVar5) {
          return NAN;
        }
        bVar2 = true;
        if (((0x40000000000087U >> ((ulong)uVar5 & 0x3f) & 1) == 0) &&
           (bVar2 = bVar3, (0x2000000000000060U >> ((ulong)uVar5 & 0x3f) & 1) == 0)) {
          return NAN;
        }
      }
      bVar3 = bVar2;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&substr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ustring,1,
               ival - 2);
    ind = 0;
    if (bVar3) {
      local_50 = generateLeadingNumber(&substr,&ind);
    }
    else {
      local_50 = getDoubleFromString(&substr,&ind);
    }
    if (ind < substr._M_string_length) {
      std::__cxx11::string::~string((string *)&substr);
      return NAN;
    }
    *index = ival;
    std::__cxx11::string::~string((string *)&substr);
  }
  else {
    local_50 = getDoubleFromString(ustring,index);
  }
  if (NAN(local_50)) {
    return local_50;
  }
  uVar4 = *index;
  if (uVar4 < ustring->_M_string_length) {
    if ((ustring->_M_dataplus)._M_p[uVar4] != '^') {
      return local_50;
    }
    ival = 0;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&substr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ustring,
               uVar4 + 1,0xffffffffffffffff);
    local_40 = getNumberBlock(&substr,&ival);
    std::__cxx11::string::~string((string *)&substr);
    if (NAN(local_40)) {
      *index = 0;
      return NAN;
    }
    *index = ival + *index + 1;
    dVar6 = pow(local_50,local_40);
    return dVar6;
  }
  return local_50;
}

Assistant:

static double getNumberBlock(const std::string& ustring, size_t& index) noexcept
{
    double val{constants::invalid_conversion};
    if (ustring.front() == '(') {
        size_t ival{1};
        if (segmentcheck(ustring, ')', ival)) {
            if (ival == 2) {
                index = ival;
                return 1.0;
            }
            bool hasOp = false;
            for (size_t ii = 1; ii < ival - 1; ++ii) {
                auto c = ustring[ii];
                if (c >= '0' && c <= '9') {
                    continue;
                }
                switch (c) {
                    case '-':
                    case '.':
                    case 'e':
                        break;
                    case '*':
                    case '/':
                    case '^':
                    case '(':
                    case ')':
                        hasOp = true;
                        break;
                    default:
                        return constants::invalid_conversion;
                }
            }
            auto substr = ustring.substr(1, ival - 2);
            size_t ind{0};
            if (hasOp) {
                val = generateLeadingNumber(substr, ind);
            } else {
                val = getDoubleFromString(substr, &ind);
            }
            if (ind < substr.size()) {
                return constants::invalid_conversion;
            }
            index = ival;
        } else {
            return constants::invalid_conversion;
        }
    } else {
        val = getDoubleFromString(ustring, &index);
    }
    if (!std::isnan(val) && index < ustring.size()) {
        if (ustring[index] == '^') {
            size_t nindex{0};
            double pval = getNumberBlock(ustring.substr(index + 1), nindex);
            if (!std::isnan(pval)) {
                index += nindex + 1;
                return std::pow(val, pval);
            }
            index = 0;
            return constants::invalid_conversion;
        }
    }
    return val;
}